

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void canvas_find_again(_glist *x)

{
  uint in_EAX;
  uint uVar1;
  uint uVar2;
  int myindex;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  if (canvas_whichfind != (_glist *)0x0 && *(long *)((pd_maininstance.pd_gui)->i_editor + 0x60) != 0
     ) {
    uVar1 = canvas_dofind(canvas_whichfind,(int *)((long)&uStack_28 + 4));
    uVar2 = *(int *)((pd_maininstance.pd_gui)->i_editor + 0x58) + 1;
    *(uint *)((pd_maininstance.pd_gui)->i_editor + 0x58) = uVar2;
    pdgui_vmess("pdtk_showfindresult","^ iii",x,(ulong)uVar1,(ulong)uVar2,uStack_28 >> 0x20);
    if (uVar1 == 0) {
      *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x58) = 0;
    }
  }
  return;
}

Assistant:

static void canvas_find_again(t_canvas *x)
{
    int myindex = 0, found;
    if (!EDITOR->canvas_findbuf || !canvas_whichfind)
        return;
    found = canvas_dofind(canvas_whichfind, &myindex);
    pdgui_vmess("pdtk_showfindresult", "^ iii",
        x,
       found, ++EDITOR->canvas_find_index, myindex);
    if (!found)
        EDITOR->canvas_find_index = 0;
}